

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O2

TValue * cpcall(lua_State *L,lua_CFunction func,void *ud)

{
  TValue *pTVar1;
  ulong uVar2;
  GCRef *pGVar3;
  GCfunc *pGVar4;
  void *pvVar5;
  
  uVar2 = (ulong)L->base[-1].u32.lo;
  pGVar3 = &L->env;
  if (*(char *)(uVar2 + 5) == '\b') {
    pGVar3 = (GCRef *)(uVar2 + 8);
  }
  pGVar4 = lj_func_newC(L,0,(GCtab *)(ulong)pGVar3->gcptr32);
  pTVar1 = L->top;
  (pGVar4->c).f = func;
  (pTVar1->u32).lo = (uint32_t)pGVar4;
  (pTVar1->field_2).it = 0xfffffff7;
  pvVar5 = lj_lightud_intern(L,ud);
  pTVar1[1].u64 = (ulong)pvVar5 | 0xffff000000000000;
  *(undefined4 *)((long)L->cframe + 0x10) = 1;
  L->top = pTVar1 + 2;
  return pTVar1 + 1;
}

Assistant:

static TValue *cpcall(lua_State *L, lua_CFunction func, void *ud)
{
  GCfunc *fn = lj_func_newC(L, 0, getcurrenv(L));
  TValue *top = L->top;
  fn->c.f = func;
  setfuncV(L, top++, fn);
  if (LJ_FR2) setnilV(top++);
#if LJ_64
  ud = lj_lightud_intern(L, ud);
#endif
  setrawlightudV(top++, ud);
  cframe_nres(L->cframe) = 1+0;  /* Zero results. */
  L->top = top;
  return top-1;  /* Now call the newly allocated C function. */
}